

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long *local_c8;
  size_t local_c0;
  long local_b8 [2];
  undefined8 local_a8;
  char *local_a0;
  AlphaNum local_78;
  AlphaNum local_48;
  
  local_48.piece_._M_len = 0x20;
  local_48.piece_._M_str = "undefined annotation variable: \"";
  absl::lts_20240722::CHexEscape_abi_cxx11_(&local_c8,*(undefined8 *)this,*(undefined8 *)(this + 8))
  ;
  local_78.piece_._M_len = local_c0;
  local_78.piece_._M_str = (char *)local_c8;
  local_a8 = 1;
  local_a0 = "\"";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_48,&local_78);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}